

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TimingOf<std::chrono::_V2::steady_clock,_const_Catch::Benchmark::Detail::BenchmarkFunction_&,_run_for_at_least_argument_t<steady_clock,_const_BenchmarkFunction_&>_>
 Catch::Benchmark::Detail::
 run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::BenchmarkFunction_const&>
           (ClockDuration<std::chrono::_V2::steady_clock> how_long,int seed,BenchmarkFunction *fun)

{
  ulong uVar1;
  BenchmarkFunction *pBVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  TimingOf<std::chrono::_V2::steady_clock,_const_Catch::Benchmark::Detail::BenchmarkFunction_&,_Chronometer>
  TVar4;
  TimingOf<std::chrono::_V2::steady_clock,_const_Catch::Benchmark::Detail::BenchmarkFunction_&,_run_for_at_least_argument_t<steady_clock,_const_BenchmarkFunction_&>_>
  TVar5;
  optimized_away_error local_20;
  
  pBVar2 = fun;
  uVar1 = CONCAT44(in_register_00000034,seed);
  do {
    uVar3 = uVar1;
    if (0x3fffffff < (int)uVar3) {
      local_20 = (optimized_away_error)&PTR__exception_00193cf8;
      throw_exception<Catch::Benchmark::Detail::optimized_away_error>(&local_20);
    }
    TVar4 = measure_one<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::BenchmarkFunction_const&>
                      (fun,uVar3,pBVar2);
    pBVar2 = TVar4._8_8_;
    TVar5.elapsed = TVar4.elapsed.__r;
    uVar1 = (ulong)(uint)((int)uVar3 * 2);
  } while (TVar5.elapsed.__r < how_long.__r);
  TVar5._8_8_ = uVar3 << 0x20;
  return TVar5;
}

Assistant:

TimingOf<Clock, Fun, run_for_at_least_argument_t<Clock, Fun>> run_for_at_least(ClockDuration<Clock> how_long, int seed, Fun&& fun) {
                auto iters = seed;
                while (iters < (1 << 30)) {
                    auto&& Timing = measure_one<Clock>(fun, iters, is_callable<Fun(Chronometer)>());

                    if (Timing.elapsed >= how_long) {
                        return { Timing.elapsed, std::move(Timing.result), iters };
                    }
                    iters *= 2;
                }
                Catch::throw_exception(optimized_away_error{});
            }